

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O3

FT_Error cid_read_subrs(CID_Face face)

{
  uint uVar1;
  FT_Stream pFVar2;
  CID_FaceDict pCVar3;
  ulong uVar4;
  undefined8 *puVar5;
  FT_Memory pFVar6;
  uint uVar7;
  CID_Subrs pCVar8;
  ulong *block;
  uchar *puVar9;
  FT_Byte **ppFVar10;
  FT_Byte *pFVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  FT_ULong count;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  FT_Error error;
  FT_Error local_6c;
  FT_Memory local_68;
  FT_Stream local_60;
  ulong local_58;
  ulong local_50;
  uint local_48;
  FT_Int local_44;
  ulong local_40;
  void *local_38;
  
  local_68 = (face->root).memory;
  pFVar2 = face->cid_stream;
  local_38 = face->psaux;
  block = (ulong *)0x0;
  pCVar8 = (CID_Subrs)
           ft_mem_realloc(local_68,0x10,0,(ulong)(face->cid).num_dicts,(void *)0x0,&local_6c);
  face->subrs = pCVar8;
  if (local_6c == 0) {
    uVar13 = (face->cid).num_dicts;
    uVar7 = 0;
    if (uVar13 == 0) {
      block = (ulong *)0x0;
    }
    else {
      uVar19 = 0;
      block = (ulong *)0x0;
      local_60 = pFVar2;
      do {
        pCVar3 = (face->cid).font_dicts;
        uVar16 = uVar19 * 0x150;
        uVar1 = pCVar3[uVar19].num_subrs;
        if ((ulong)uVar1 != 0) {
          local_44 = pCVar3[uVar19].private_dict.lenIV;
          local_50 = (ulong)(uVar1 + 1);
          local_40 = uVar19;
          if (uVar7 < uVar1 + 1) {
            uVar13 = (uVar1 & 0xfffffffc) + 4;
            if (uVar7 < uVar13) {
              local_58 = uVar16;
              block = (ulong *)ft_mem_qrealloc(local_68,8,(ulong)uVar7,(ulong)uVar13,block,&local_6c
                                              );
              uVar16 = local_58;
              uVar7 = uVar13;
              if (local_6c == 0) goto LAB_00226478;
            }
            else {
              local_6c = 0xa0;
            }
          }
          else {
LAB_00226478:
            pFVar2 = local_60;
            local_48 = uVar7;
            local_6c = FT_Stream_Seek(local_60,*(long *)((long)&pCVar3->subrmap_offset + uVar16) +
                                               (face->cid).data_offset);
            if (local_6c == 0) {
              iVar18 = (int)local_50;
              local_58 = (ulong)uVar1;
              local_6c = FT_Stream_EnterFrame
                                   (pFVar2,(ulong)(uint)(*(int *)((long)&pCVar3->sd_bytes + uVar16)
                                                        * iVar18));
              uVar19 = local_58;
              if (local_6c == 0) {
                puVar9 = pFVar2->cursor;
                uVar13 = *(uint *)((long)&pCVar3->sd_bytes + uVar16);
                uVar16 = 0;
                do {
                  if ((ulong)uVar13 == 0) {
                    uVar17 = 0;
                  }
                  else {
                    lVar14 = 0;
                    uVar17 = 0;
                    do {
                      uVar17 = uVar17 << 8 | (ulong)puVar9[lVar14];
                      lVar14 = lVar14 + 1;
                    } while (uVar13 != (uint)lVar14);
                  }
                  block[uVar16] = uVar17;
                  uVar16 = uVar16 + 1;
                  puVar9 = puVar9 + uVar13;
                } while (uVar16 != iVar18 + (uint)(iVar18 == 0));
                FT_Stream_ExitFrame(local_60);
                pFVar6 = local_68;
                uVar13 = 1;
                uVar16 = *block;
                do {
                  uVar17 = (ulong)uVar13;
                  if (block[uVar17] < uVar16) goto LAB_00226692;
                  uVar13 = uVar13 + 1;
                  uVar16 = block[uVar17];
                } while (uVar13 <= (uint)uVar19);
                if (local_60->size - (face->cid).data_offset < block[uVar19]) {
LAB_00226692:
                  local_6c = 3;
                }
                else {
                  count = block[uVar19] - *block;
                  ppFVar10 = (FT_Byte **)
                             ft_mem_qrealloc(local_68,8,0,local_50 & 0xffffffff,(void *)0x0,
                                             &local_6c);
                  pCVar8->code = ppFVar10;
                  if (local_6c == 0) {
                    pFVar11 = (FT_Byte *)ft_mem_qalloc(pFVar6,count,&local_6c);
                    pFVar2 = local_60;
                    *pCVar8->code = pFVar11;
                    if (((local_6c == 0) &&
                        (local_6c = FT_Stream_Seek(local_60,*block + (face->cid).data_offset),
                        local_6c == 0)) &&
                       (local_6c = FT_Stream_Read(pFVar2,*pCVar8->code,count), pvVar15 = local_38,
                       local_6c == 0)) {
                      uVar16 = local_50 & 0xffffffff;
                      if ((uint)local_50 < 3) {
                        uVar16 = 2;
                      }
                      uVar12 = 1;
                      uVar17 = *block;
                      do {
                        uVar4 = block[uVar12];
                        pCVar8->code[uVar12] = pCVar8->code[uVar12 - 1] + (uVar4 - uVar17);
                        uVar12 = uVar12 + 1;
                        uVar17 = uVar4;
                      } while (uVar16 != uVar12);
                      if (-1 < local_44) {
                        uVar16 = 0;
                        do {
                          uVar17 = uVar16 + 1;
                          (**(code **)((long)pvVar15 + 0x20))
                                    (pCVar8->code[uVar16],block[uVar16 + 1] - block[uVar16],0x10ea);
                          uVar16 = uVar17;
                        } while (uVar19 != uVar17);
                      }
                      pCVar8->num_subrs = (uint)uVar19;
                      uVar13 = (face->cid).num_dicts;
                      uVar19 = local_40;
                      uVar7 = local_48;
                      goto LAB_0022667b;
                    }
                  }
                }
              }
            }
          }
          pFVar6 = local_68;
          pCVar8 = face->subrs;
          if (pCVar8 != (CID_Subrs)0x0) {
            if ((face->cid).num_dicts != 0) {
              lVar14 = 8;
              uVar19 = 0;
              do {
                puVar5 = *(undefined8 **)((long)&pCVar8->num_subrs + lVar14);
                if (puVar5 == (undefined8 *)0x0) {
                  pvVar15 = (void *)0x0;
                }
                else {
                  ft_mem_free(pFVar6,(void *)*puVar5);
                  **(undefined8 **)((long)&face->subrs->num_subrs + lVar14) = 0;
                  pvVar15 = *(void **)((long)&face->subrs->num_subrs + lVar14);
                }
                ft_mem_free(pFVar6,pvVar15);
                pCVar8 = face->subrs;
                *(undefined8 *)((long)&pCVar8->num_subrs + lVar14) = 0;
                uVar19 = uVar19 + 1;
                lVar14 = lVar14 + 0x10;
              } while (uVar19 < (face->cid).num_dicts);
            }
            ft_mem_free(pFVar6,pCVar8);
            face->subrs = (CID_Subrs)0x0;
          }
          break;
        }
LAB_0022667b:
        uVar19 = uVar19 + 1;
        pCVar8 = pCVar8 + 1;
      } while (uVar19 < uVar13);
    }
  }
  ft_mem_free(local_68,block);
  return local_6c;
}

Assistant:

static FT_Error
  cid_read_subrs( CID_Face  face )
  {
    CID_FaceInfo   cid    = &face->cid;
    FT_Memory      memory = face->root.memory;
    FT_Stream      stream = face->cid_stream;
    FT_Error       error;
    FT_UInt        n;
    CID_Subrs      subr;
    FT_UInt        max_offsets = 0;
    FT_ULong*      offsets = NULL;
    PSAux_Service  psaux = (PSAux_Service)face->psaux;


    if ( FT_NEW_ARRAY( face->subrs, cid->num_dicts ) )
      goto Exit;

    subr = face->subrs;
    for ( n = 0; n < cid->num_dicts; n++, subr++ )
    {
      CID_FaceDict  dict  = cid->font_dicts + n;
      FT_Int        lenIV = dict->private_dict.lenIV;
      FT_UInt       count, num_subrs = dict->num_subrs;
      FT_ULong      data_len;
      FT_Byte*      p;


      if ( !num_subrs )
        continue;

      /* reallocate offsets array if needed */
      if ( num_subrs + 1 > max_offsets )
      {
        FT_UInt  new_max = FT_PAD_CEIL( num_subrs + 1, 4 );


        if ( new_max <= max_offsets )
        {
          error = FT_THROW( Syntax_Error );
          goto Fail;
        }

        if ( FT_QRENEW_ARRAY( offsets, max_offsets, new_max ) )
          goto Fail;

        max_offsets = new_max;
      }

      /* read the subrmap's offsets */
      if ( FT_STREAM_SEEK( cid->data_offset + dict->subrmap_offset ) ||
           FT_FRAME_ENTER( ( num_subrs + 1 ) * dict->sd_bytes )      )
        goto Fail;

      p = (FT_Byte*)stream->cursor;
      for ( count = 0; count <= num_subrs; count++ )
        offsets[count] = cid_get_offset( &p, dict->sd_bytes );

      FT_FRAME_EXIT();

      /* offsets must be ordered */
      for ( count = 1; count <= num_subrs; count++ )
        if ( offsets[count - 1] > offsets[count] )
        {
          FT_ERROR(( "cid_read_subrs: offsets are not ordered\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

      if ( offsets[num_subrs] > stream->size - cid->data_offset )
      {
        FT_ERROR(( "cid_read_subrs: too large `subrs' offsets\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* now, compute the size of subrs charstrings, */
      /* allocate, and read them                     */
      data_len = offsets[num_subrs] - offsets[0];

      if ( FT_QNEW_ARRAY( subr->code, num_subrs + 1 ) ||
           FT_QALLOC( subr->code[0], data_len )       )
        goto Fail;

      if ( FT_STREAM_SEEK( cid->data_offset + offsets[0] ) ||
           FT_STREAM_READ( subr->code[0], data_len )       )
        goto Fail;

      /* set up pointers */
      for ( count = 1; count <= num_subrs; count++ )
      {
        FT_ULong  len;


        len               = offsets[count] - offsets[count - 1];
        subr->code[count] = subr->code[count - 1] + len;
      }

      /* decrypt subroutines, but only if lenIV >= 0 */
      if ( lenIV >= 0 )
      {
        for ( count = 0; count < num_subrs; count++ )
        {
          FT_ULong  len;


          len = offsets[count + 1] - offsets[count];
          psaux->t1_decrypt( subr->code[count], len, 4330 );
        }
      }

      subr->num_subrs = (FT_Int)num_subrs;
    }

  Exit:
    FT_FREE( offsets );
    return error;

  Fail:
    if ( face->subrs )
    {
      for ( n = 0; n < cid->num_dicts; n++ )
      {
        if ( face->subrs[n].code )
          FT_FREE( face->subrs[n].code[0] );

        FT_FREE( face->subrs[n].code );
      }
      FT_FREE( face->subrs );
    }
    goto Exit;
  }